

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O0

expected<bool,_idx2::idx2_err_code> *
idx2::DecodeSubband(expected<bool,_idx2::idx2_err_code> *__return_storage_ptr__,idx2_file *Idx2,
                   decode_data *D,decode_state Ds,f64 Tolerance,grid *SbGrid,
                   hash_table<short,_idx2::bitstream> *StreamsPtr,brick_volume *BrickVol)

{
  allocator **ppaVar1;
  u64 *puVar2;
  int iVar3;
  u64 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  short sVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  unsigned_long *puVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  allocator **ppaVar21;
  long lVar22;
  int iVar23;
  bool bVar24;
  undefined1 uVar25;
  __type _Var26;
  bool local_1702;
  bool local_1701;
  ulong local_16d8;
  int local_16ac;
  _func_int *in_stack_ffffffffffffe988;
  bitstream *in_stack_ffffffffffffe990;
  undefined2 in_stack_ffffffffffffe998;
  idx2_err_code in_stack_ffffffffffffe99a;
  int iVar27;
  int in_stack_ffffffffffffe9a0;
  int iVar28;
  int in_stack_ffffffffffffe9ac;
  char local_164d;
  int local_15d4;
  int local_15cc;
  int local_15c4;
  bool local_15a5;
  char local_1557;
  undefined4 local_14c4;
  undefined4 local_14c0;
  undefined4 local_14bc;
  undefined4 local_14b8;
  undefined4 local_14b4;
  undefined4 local_14b0;
  undefined4 local_14ac;
  undefined4 local_14a8;
  undefined4 local_14a4;
  undefined8 local_14a0;
  int local_1498;
  undefined8 local_1490;
  int local_1488;
  undefined4 local_1484;
  undefined4 local_1480;
  undefined4 local_147c;
  undefined4 local_1478;
  undefined4 local_1474;
  undefined4 local_1470;
  undefined4 local_146c;
  undefined4 local_1468;
  undefined4 local_1464;
  brick_volume *local_1460;
  volume *BVol;
  timer DataTimer;
  undefined8 local_1434;
  v3i Strd3;
  undefined8 local_1418;
  v3i From3;
  int J;
  v3i S3;
  bool CurrBlockSignificant;
  i64 SizeEnd;
  i64 SizeBegin;
  i64 BrickOffset;
  i64 BrickInChunk;
  unsigned_long *BrickIt;
  chunk_cache *ChunkCache;
  expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> ReadChunkResult;
  bitstream *Stream;
  iterator StreamIt;
  char local_1375;
  bool TooHighPrecision;
  i16 BpKey;
  i16 RealBp;
  i8 Bp;
  int Bpc;
  i8 NBps;
  int NBitPlanesDecoded;
  i8 EndBitPlane;
  i8 N;
  allocator **ppaStack_1360;
  i16 EMax;
  buffer_t<unsigned_long> BufUInts;
  u64 BlockUInts [64];
  buffer_t<long> BufInts;
  buffer_t<double> BufFloats;
  f64 BlockFloats [64];
  int Prec;
  int NVals;
  int NDims;
  bool CodedInNextLevel;
  undefined8 local_ee0;
  int local_ed8;
  undefined8 local_ed4;
  v3i BlockDims3;
  undefined8 local_eb8;
  int local_eb0;
  bool local_ea9;
  undefined8 uStack_ea8;
  bool BypassDecode;
  int local_ea0;
  undefined8 local_e98;
  v3i D3;
  int B;
  undefined8 local_e78;
  uint local_e70;
  int local_e6c;
  int local_e68;
  v3i Z3;
  u32 Block;
  bool SubbandSignificant;
  i8 NBitPlanes;
  undefined8 local_e44;
  uint local_e3c;
  uint local_e38;
  uint local_e34;
  uint local_e2c;
  long lStack_e28;
  u32 LastBlock;
  bitstream BrickExpsStream;
  i32 BrickExpOffset;
  chunk_exp_cache *ChunkExpCache;
  undefined1 local_dd8 [8];
  expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> ReadChunkExpResult;
  int local_da8;
  int iStack_da4;
  int local_d9c;
  int BlockCount;
  undefined8 local_d68;
  int local_d60;
  undefined8 local_d58;
  int local_d50;
  undefined8 local_d4c;
  v3i NBlocks3;
  undefined8 local_d30;
  v3i SbDims3;
  u64 Brick;
  brick_volume *BrickVol_local;
  hash_table<short,_idx2::bitstream> *StreamsPtr_local;
  grid *SbGrid_local;
  f64 Tolerance_local;
  decode_data *D_local;
  idx2_file *Idx2_local;
  undefined8 local_c5c;
  bool local_c50;
  undefined7 uStack_c4f;
  int local_c48;
  v3i *local_c40;
  undefined8 *local_c38;
  int local_c2c;
  int iStack_c28;
  undefined8 local_c20;
  int local_c18;
  v3i *local_c10;
  undefined8 *local_c08;
  undefined8 local_bfc;
  undefined8 local_bf0;
  int local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 local_bd0;
  int local_bc4;
  int local_bc0;
  int local_bbc;
  undefined8 *local_bb8;
  int local_bac;
  int local_ba8;
  int local_ba4;
  undefined8 *local_ba0;
  int local_b94;
  int local_b90;
  int local_b8c;
  int *local_b88;
  int local_b7c;
  int local_b78;
  int local_b74;
  undefined8 *local_b70;
  undefined4 local_b64;
  undefined4 *local_b60;
  undefined4 local_b54;
  undefined4 *local_b50;
  undefined4 local_b44;
  undefined4 *local_b40;
  undefined4 local_b34;
  undefined4 *local_b30;
  undefined4 local_b24;
  undefined4 *local_b20;
  undefined4 local_b14;
  undefined4 *local_b10;
  undefined8 local_b08;
  int local_b00;
  undefined1 *local_af8;
  undefined8 *local_af0;
  undefined8 local_ae8;
  int local_adc;
  int local_ad8;
  int local_ad4;
  undefined8 *local_ad0;
  undefined8 local_ac8;
  int local_ac0;
  v3i *local_ab8;
  undefined8 *local_ab0;
  undefined8 local_aa8;
  int local_a9c;
  int local_a98;
  int local_a94;
  undefined8 *local_a90;
  undefined8 *local_a88;
  int *local_a80;
  undefined1 local_a78 [8];
  timespec End;
  undefined8 local_a38;
  int local_a2c;
  int local_a28;
  int local_a24;
  undefined8 *local_a20;
  undefined8 local_a18;
  uint local_a10;
  undefined4 local_a04;
  undefined8 *local_a00;
  undefined8 local_9f8;
  uint local_9ec;
  int local_9e8;
  int local_9e4;
  undefined8 *local_9e0;
  undefined8 local_9d8;
  int local_9d0;
  undefined4 local_9c4;
  undefined8 *local_9c0;
  undefined8 local_9b8;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  undefined8 *local_9a0;
  undefined8 local_998;
  int local_990;
  int *local_988;
  undefined8 *local_980;
  undefined8 local_978;
  int local_96c;
  int local_968;
  int local_964;
  undefined8 *local_960;
  v3i *local_958;
  undefined8 *local_950;
  undefined8 local_948;
  int local_940;
  undefined8 local_938;
  int local_930;
  grid *local_928;
  undefined8 local_920;
  int local_918;
  undefined8 local_910;
  int local_908;
  u64 local_900;
  undefined8 local_8f8;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  undefined8 *local_8e0;
  __syscall_slong_t local_8d8;
  int local_8d0;
  __syscall_slong_t local_8c8;
  int local_8c0;
  grid *local_8b8;
  __syscall_slong_t local_8b0;
  int local_8a8;
  __syscall_slong_t local_8a0;
  int local_898;
  u64 local_890;
  undefined8 local_888;
  int local_87c;
  int local_878;
  int local_874;
  undefined8 *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *local_858;
  expected<bool,_idx2::idx2_err_code> *local_850;
  undefined1 *local_848;
  dtype local_83d;
  uint local_83c;
  dtype local_835;
  uint local_834;
  long local_830;
  short *local_828;
  long local_820;
  undefined1 *local_818;
  uint *local_810;
  undefined8 *local_808;
  uint *local_800;
  undefined8 local_7f8;
  uint local_7f0;
  int local_7e8;
  undefined8 local_7e4;
  undefined8 *local_7d8;
  int *local_7d0;
  undefined1 local_7c1;
  int local_7c0;
  undefined4 local_7bc;
  undefined8 *local_7b8;
  int local_7ac;
  stack_array<idx2::array<idx2::v3<int>_>,_16> *local_7a8;
  long local_7a0;
  array<idx2::v3<int>_> *local_798;
  undefined8 local_790;
  int local_788;
  undefined8 *local_780;
  v3i *local_778;
  undefined8 local_770;
  int local_764;
  int local_760;
  int local_75c;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 local_748;
  double *local_740;
  allocator **local_738;
  allocator **local_730;
  undefined8 local_728;
  long *local_720;
  allocator **local_718;
  u64 *local_710;
  undefined8 local_708;
  unsigned_long *local_700;
  allocator **local_6f8;
  undefined1 *local_6f0;
  ulong local_6e8;
  u64 Result_1;
  undefined1 *local_6d8;
  ulong local_6d0;
  u64 Result;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  i8 *local_6b0;
  dtype local_6a6;
  dtype local_6a5;
  int local_6a4;
  undefined4 local_6a0;
  int local_69c;
  f64 fStack_698;
  int E_1;
  int local_68c;
  undefined4 local_688;
  int local_684;
  f64 fStack_680;
  int E;
  int local_674;
  bitstream **local_670;
  chunk_cache **local_668;
  chunk_cache **local_660;
  _func_int **local_658;
  _func_int **local_650;
  _func_int **local_648;
  bool local_640;
  undefined7 uStack_63f;
  bool local_638;
  undefined7 uStack_637;
  ulong local_630;
  u64 X;
  undefined1 local_620 [7];
  i8 P;
  bitstream Bs;
  u64 Result_4;
  u64 Result_3;
  int local_5a0;
  int local_59c;
  int I_3;
  int I_2;
  int I_1;
  int I;
  u64 Mask;
  int local_56c;
  int local_568;
  int Y_6;
  int X_6;
  int Y_3;
  int Z_3;
  int Z_1;
  int X_3;
  int X_1;
  int Y;
  int local_53c;
  int I_4;
  f64 Scale;
  undefined8 local_4f8;
  int local_4f0;
  undefined8 local_4e8;
  int local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  brick_volume *local_4c0;
  undefined8 local_4b8;
  int local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 local_498;
  int local_48c;
  int local_488;
  int local_484;
  undefined8 *local_480;
  undefined8 local_478;
  int local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 local_458;
  int local_44c;
  int local_448;
  int local_444;
  undefined8 *local_440;
  undefined1 *local_438;
  expected<bool,_idx2::idx2_err_code> *local_430;
  uint local_424;
  uint local_420;
  uint local_41c;
  uint local_418;
  uint local_414;
  uint local_410;
  uint local_40c;
  uint local_408;
  uint local_404;
  undefined8 *local_400;
  int *local_3f8;
  int *local_3f0;
  long local_3e8;
  int *local_3e0;
  undefined8 *local_3d8;
  v3i *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  ulong local_3a8;
  u64 Remaining_5;
  undefined1 *local_398;
  undefined4 local_38c;
  stack_array<unsigned_long,_65> *local_388;
  ulong local_380;
  u64 Remaining_4;
  undefined1 *local_370;
  undefined4 local_364;
  stack_array<unsigned_long,_65> *local_360;
  ulong local_358;
  u64 Remaining;
  undefined1 *local_348;
  undefined4 local_33c;
  stack_array<unsigned_long,_65> *local_338;
  ulong local_330;
  u64 Remaining_1;
  undefined1 *local_320;
  undefined4 local_314;
  stack_array<unsigned_long,_65> *local_310;
  undefined4 local_304;
  undefined1 *local_300;
  undefined4 local_2f4;
  undefined1 *local_2f0;
  undefined4 local_2e4;
  undefined1 *local_2e0;
  undefined4 local_2d4;
  undefined1 *local_2d0;
  undefined4 *local_2c8;
  int *local_2c0;
  undefined4 *local_2b8;
  int *local_2b0;
  ulong local_2a8;
  u64 Result_2;
  int local_298;
  int local_294;
  int FirstBatchCount;
  long local_288;
  int *local_280;
  undefined1 *local_278;
  ulong local_270;
  u64 Remaining_3;
  undefined1 *local_260;
  int local_254;
  stack_array<unsigned_long,_65> *local_250;
  ulong local_248;
  u64 Remaining_2;
  undefined1 *local_238;
  int local_22c;
  stack_array<unsigned_long,_65> *local_228;
  int local_21c;
  undefined1 *local_218;
  int local_20c;
  undefined1 *local_208;
  allocator *local_200;
  long W;
  long Z;
  long Y_1;
  long X_2;
  allocator **local_1d8;
  allocator *local_1d0;
  long W_1;
  long Z_2;
  long Y_2;
  long X_4;
  allocator **local_1a8;
  allocator *local_1a0;
  long W_2;
  long Z_4;
  long Y_4;
  long X_5;
  allocator **local_178;
  allocator *local_170;
  long W_3;
  long Z_5;
  long Y_5;
  long X_7;
  allocator **local_148;
  allocator *local_140;
  long W_4;
  long Z_6;
  long Y_7;
  long X_8;
  allocator **local_118;
  long local_110;
  long W_5;
  long Z_7;
  long Y_8;
  long X_9;
  allocator **local_e8;
  u64 *local_e0;
  long local_d8;
  u64 *local_d0;
  long local_c8;
  allocator **local_c0;
  undefined8 local_b8;
  int local_b0;
  undefined8 local_a4;
  v3i D3_1;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_18;
  undefined8 *local_10;
  
  stack0xfffffffffffff2e0 = Ds.Brick;
  uVar4 = (SbGrid->super_extent).Dims;
  local_a24 = ((int)uVar4 << 0xb) >> 0xb;
  local_a20 = &local_a38;
  local_a28 = (int)((long)(uVar4 << 0x16) >> 0x2b);
  SbDims3.field_0.field_0.X = (int)((long)(uVar4 * 2) >> 0x2b);
  local_a38._0_4_ = local_a24;
  local_a38._4_4_ = local_a28;
  NBlocks3.field_0._4_8_ = local_a38;
  local_d30 = local_a38;
  uVar10 = local_d30;
  local_ab8 = &Idx2->BlockDims3;
  local_ab0 = &local_d30;
  local_d30._0_4_ = (int)local_a38;
  local_d30._4_4_ = (int)((ulong)local_a38 >> 0x20);
  local_a94 = (int)local_d30 + (local_ab8->field_0).field_0.X;
  local_a98 = local_d30._4_4_ + (Idx2->BlockDims3).field_0.field_0.Y;
  local_d60 = SbDims3.field_0.field_0.X + (Idx2->BlockDims3).field_0.field_0.Z;
  local_a90 = &local_aa8;
  local_aa8._0_4_ = local_a94;
  local_aa8._4_4_ = local_a98;
  local_ac8 = local_aa8;
  local_d68 = local_aa8;
  uVar6 = local_d68;
  local_9c0 = &local_d68;
  local_9c4 = 1;
  local_d68._0_4_ = (int)local_aa8;
  local_d68._4_4_ = (int)((ulong)local_aa8 >> 0x20);
  local_9a4 = (int)local_d68 + -1;
  local_9a8 = local_d68._4_4_ + -1;
  local_d50 = local_d60 + -1;
  local_9a0 = &local_9b8;
  local_9b8._0_4_ = local_9a4;
  local_9b8._4_4_ = local_9a8;
  local_9d8 = local_9b8;
  local_d58 = local_9b8;
  uVar9 = local_d58;
  local_c10 = &Idx2->BlockDims3;
  local_c08 = &local_d58;
  local_d58._0_4_ = (int)local_9b8;
  local_d58._4_4_ = (int)((ulong)local_9b8 >> 0x20);
  local_ba4 = (int)local_d58 / (local_c10->field_0).field_0.X;
  local_ba8 = local_d58._4_4_ / (Idx2->BlockDims3).field_0.field_0.Y;
  NBlocks3.field_0.field_0.X = local_d50 / (Idx2->BlockDims3).field_0.field_0.Z;
  local_ba0 = &local_bfc;
  local_bfc._0_4_ = local_ba4;
  local_bfc._4_4_ = local_ba8;
  local_c20 = local_bfc;
  local_d4c = local_bfc;
  uVar8 = local_d4c;
  local_d4c._0_4_ = (int)local_bfc;
  local_d4c._4_4_ = (int)((ulong)local_bfc >> 0x20);
  local_d9c = (int)local_d4c * local_d4c._4_4_ * NBlocks3.field_0.field_0.X;
  if ((Ds.Subband == '\0') && (Ds.Level + 1 < (int)Idx2->NLevels)) {
    local_c40 = &Idx2->BlockDims3;
    local_c38 = &local_d30;
    local_b8c = (int)local_d30 / (local_c40->field_0).field_0.X;
    local_b90 = local_d30._4_4_ / (Idx2->BlockDims3).field_0.field_0.Y;
    local_c48 = SbDims3.field_0.field_0.X / (Idx2->BlockDims3).field_0.field_0.Z;
    local_b88 = &local_c2c;
    local_c2c = local_b8c;
    iStack_c28 = local_b90;
    local_c50 = local_c2c._0_1_;
    uStack_c4f = stack0xfffffffffffff3d5;
    ReadChunkExpResult.Ok = local_c2c._0_1_;
    ReadChunkExpResult._25_7_ = stack0xfffffffffffff3d5;
    local_da8 = (int)_local_c2c;
    iStack_da4 = SUB84(_local_c2c,4);
    local_d9c = local_d9c - local_da8 * iStack_da4 * local_c48;
    local_b94 = local_c48;
  }
  local_d68 = uVar6;
  local_d58 = uVar9;
  local_d4c = uVar8;
  local_d30 = uVar10;
  local_c18 = NBlocks3.field_0.field_0.X;
  local_bac = NBlocks3.field_0.field_0.X;
  local_ac0 = local_d60;
  local_a9c = local_d60;
  local_a2c = SbDims3.field_0.field_0.X;
  local_9d0 = local_d50;
  local_9ac = local_d50;
  ReadChunkExponents((expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *)local_dd8,Idx2,
                     D,Ds.Brick,Ds.Level,Ds.Subband);
  local_868 = local_dd8;
  if ((ReadChunkExpResult.field_1.Err.Code & UnknownError) == NoError) {
    local_860 = local_dd8;
    local_858 = &ReadChunkExpResult;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002bfb30;
    (__return_storage_ptr__->field_1).Err.Msg = (cstr)ReadChunkExpResult._vptr_expected;
    *(chunk_exp_cache **)((long)&__return_storage_ptr__->field_1 + 8) =
         ReadChunkExpResult.field_1.Val;
    __return_storage_ptr__->Ok = false;
    local_850 = __return_storage_ptr__;
  }
  else {
    local_848 = local_dd8;
    local_835 = Idx2->DType;
    switch(local_835) {
    case int8:
    case uint8:
      local_834 = 1;
      break;
    case int16:
    case uint16:
      local_834 = 2;
      break;
    case int32:
    case uint32:
    case float32:
      local_834 = 4;
      break;
    case int64:
    case uint64:
    case float64:
      local_834 = 8;
      break;
    default:
      local_834 = 0;
    }
    iVar13 = 1;
    if (4 < local_834) {
      iVar13 = 2;
    }
    BrickExpsStream._44_4_ = Ds.BrickInChunk * local_d9c * iVar13;
    memcpy(&stack0xfffffffffffff1d8,ReadChunkExpResult._vptr_expected + 1,0x30);
    local_820 = (long)(int)BrickExpsStream._44_4_;
    local_818 = (undefined1 *)&stack0xfffffffffffff1d8;
    BrickExpsStream.BitPtr = (byte *)(BrickExpsStream.Stream.Alloc)->_vptr_allocator;
    BrickExpsStream.BitBuf._0_4_ = 0;
    local_a00 = &local_d4c;
    local_a04 = 1;
    local_9e4 = (int)local_d4c + -1;
    local_9e8 = local_d4c._4_4_ + -1;
    local_a10 = NBlocks3.field_0.field_0.X - 1;
    local_9e0 = &local_9f8;
    local_9f8._0_4_ = local_9e4;
    local_9f8._4_4_ = local_9e8;
    local_a18 = local_9f8;
    local_e44 = local_9f8;
    uVar6 = local_e44;
    local_800 = &local_e38;
    local_808 = &local_e44;
    local_e44._0_4_ = (uint)local_9f8;
    local_e38 = (uint)local_e44;
    local_e44._4_4_ = (uint)((ulong)local_9f8 >> 0x20);
    local_e34 = local_e44._4_4_;
    local_810 = &local_e38;
    uVar12 = ((uint)local_e44 & 0x3ff ^ ((uint)local_e44 & 0x3ff) << 0x10) & 0x30000ff;
    uVar12 = (uVar12 ^ uVar12 << 8) & 0x300f00f;
    uVar12 = (uVar12 ^ uVar12 << 4) & 0x30c30c3;
    local_41c = (uVar12 ^ uVar12 << 2) & 0x9249249;
    uVar12 = (local_e44._4_4_ & 0x3ff ^ (local_e44._4_4_ & 0x3ff) << 0x10) & 0x30000ff;
    uVar12 = (uVar12 ^ uVar12 << 8) & 0x300f00f;
    uVar12 = (uVar12 ^ uVar12 << 4) & 0x30c30c3;
    local_420 = (uVar12 ^ uVar12 << 2) & 0x9249249;
    uVar12 = (local_e3c & 0x3ff ^ (local_e3c & 0x3ff) << 0x10) & 0x30000ff;
    uVar12 = (uVar12 ^ uVar12 << 8) & 0x300f00f;
    uVar12 = (uVar12 ^ uVar12 << 4) & 0x30c30c3;
    local_424 = (uVar12 ^ uVar12 << 2) & 0x9249249;
    local_e2c = local_41c | local_420 << 1 | local_424 << 2;
    Z3.field_0.field_0.Z._3_1_ = 0x40;
    local_e44 = uVar6;
    local_e3c = local_a10;
    local_9ec = local_a10;
    BrickExpsStream.Stream.Alloc = (allocator *)(lStack_e28 + local_820);
    Clear<short,idx2::bitstream>(StreamsPtr);
    Z3.field_0.field_0.Z._2_1_ = 0;
    for (Z3.field_0.field_0.Y = 0; (uint)Z3.field_0.field_0.Y <= local_e2c;
        Z3.field_0.field_0.Y = Z3.field_0.field_0.Y + 1) {
      local_7e8 = Z3.field_0.field_0.Y;
      uVar12 = (Z3.field_0.field_0.Y & 0x9249249U ^ (Z3.field_0.field_0.Y & 0x9249249U) >> 2) &
               0x30c30c3;
      uVar12 = (uVar12 ^ uVar12 >> 4) & 0x300f00f;
      uVar12 = (uVar12 ^ uVar12 >> 8) & 0x30000ff;
      local_410 = (uVar12 ^ uVar12 >> 0x10) & 0x3ff;
      uVar12 = (uint)Z3.field_0.field_0.Y >> 1 & 0x9249249;
      uVar12 = (uVar12 ^ uVar12 >> 2) & 0x30c30c3;
      uVar12 = (uVar12 ^ uVar12 >> 4) & 0x300f00f;
      uVar12 = (uVar12 ^ uVar12 >> 8) & 0x30000ff;
      local_414 = (uVar12 ^ uVar12 >> 0x10) & 0x3ff;
      uVar12 = (uint)Z3.field_0.field_0.Y >> 2 & 0x9249249;
      uVar12 = (uVar12 ^ uVar12 >> 2) & 0x30c30c3;
      uVar12 = (uVar12 ^ uVar12 >> 4) & 0x300f00f;
      uVar12 = (uVar12 ^ uVar12 >> 8) & 0x30000ff;
      local_7f0 = (uVar12 ^ uVar12 >> 0x10) & 0x3ff;
      local_400 = &local_7e4;
      local_7e4._0_4_ = local_410;
      local_7e4._4_4_ = local_414;
      local_7f8 = local_7e4;
      stack0xfffffffffffff178 = local_7e4;
      local_e78 = local_7e4;
      uVar6 = local_e78;
      local_7d0 = &local_e6c;
      local_7d8 = &local_e78;
      local_e78._0_4_ = (int)local_7e4;
      local_e6c = (int)local_e78;
      local_e78._4_4_ = (int)((ulong)local_7e4 >> 0x20);
      local_e68 = local_e78._4_4_;
      Z3.field_0.field_0.X = local_e70;
      local_a80 = &local_e6c;
      local_a88 = &local_d4c;
      bVar24 = false;
      if ((int)local_e78 < (int)local_d4c) {
        bVar24 = false;
        if (local_e78._4_4_ < local_d4c._4_4_) {
          bVar24 = (int)local_e70 < NBlocks3.field_0.field_0.X;
        }
      }
      local_e78 = uVar6;
      local_418 = local_7f0;
      local_40c = local_7f0;
      local_408 = local_414;
      local_404 = local_410;
      if (bVar24) {
        local_b74 = (int)local_e78 * (Idx2->BlockDims3).field_0.field_0.X;
        local_b78 = local_e78._4_4_ * (Idx2->BlockDims3).field_0.field_0.Y;
        local_ea0 = local_e70 * (Idx2->BlockDims3).field_0.field_0.Z;
        local_b70 = &local_c5c;
        local_c5c._0_4_ = local_b74;
        local_c5c._4_4_ = local_b78;
        uStack_ea8 = local_c5c;
        local_e98 = local_c5c;
        uVar6 = local_e98;
        local_7a8 = &Idx2->DecodeSubbandSpacings;
        local_7ac = (int)Ds.Level;
        D3.field_0.field_0.X = local_ea0;
        local_b7c = local_ea0;
        if (0xf < local_7ac) {
          local_e70 = local_7f0;
          __assert_fail("Idx < N",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                        ,0x20c,
                        "t &idx2::stack_array<idx2::array<idx2::v3<int>>, 16>::operator[](int) const [t = idx2::array<idx2::v3<int>>, N = 16]"
                       );
        }
        local_798 = local_7a8->Arr + local_7ac;
        local_7a0 = (long)Ds.Subband;
        local_988 = (int *)((local_798->Buffer).Data + local_7a0 * 0xc);
        local_980 = &local_e98;
        local_e98._0_4_ = (int)local_c5c;
        local_e98._4_4_ = (int)((ulong)local_c5c >> 0x20);
        local_964 = (int)local_e98 % *local_988;
        local_968 = local_e98._4_4_ % local_988[1];
        local_eb0 = local_ea0 % local_988[2];
        local_960 = &local_978;
        local_978._0_4_ = local_964;
        local_978._4_4_ = local_968;
        local_998 = local_978;
        BlockDims3.field_0._4_8_ = local_978;
        local_eb8 = local_978;
        uVar9 = local_eb8;
        local_7b8 = &local_eb8;
        local_7bc = 0;
        local_eb8._0_4_ = (int)local_978;
        local_15a5 = true;
        if ((int)local_eb8 == 0) {
          local_eb8._4_4_ = (int)((ulong)local_978 >> 0x20);
          local_15a5 = true;
          if (local_eb8._4_4_ == 0) {
            local_15a5 = local_eb0 != 0;
          }
        }
        local_ea9 = local_15a5;
        local_778 = &Idx2->BlockDims3;
        local_bd8 = &local_d30;
        local_be0 = &local_e98;
        local_bbc = (int)local_d30 - (int)local_e98;
        local_bc0 = local_d30._4_4_ - local_e98._4_4_;
        local_ed8 = SbDims3.field_0.field_0.X - local_ea0;
        local_bb8 = &local_bd0;
        local_bd0._0_4_ = local_bbc;
        local_bd0._4_4_ = local_bc0;
        local_bf0 = local_bd0;
        local_ee0 = local_bd0;
        uVar8 = local_ee0;
        local_780 = &local_ee0;
        local_ee0._0_4_ = (int)local_bd0;
        if ((int)local_ee0 < (local_778->field_0).field_0.X) {
          local_15c4 = (int)local_ee0;
        }
        else {
          local_15c4 = (local_778->field_0).field_0.X;
        }
        local_3e0 = &(Idx2->BlockDims3).field_0.field_0.Y;
        local_3e8 = (long)&local_ee0 + 4;
        local_ee0._4_4_ = (int)((ulong)local_bd0 >> 0x20);
        if (local_ee0._4_4_ < *local_3e0) {
          local_15cc = local_ee0._4_4_;
        }
        else {
          local_15cc = *local_3e0;
        }
        local_3f0 = &(Idx2->BlockDims3).field_0.field_0.Z;
        local_3f8 = &local_ed8;
        local_15d4 = local_ed8;
        if (*local_3f0 <= local_ed8) {
          local_15d4 = *local_3f0;
        }
        local_758 = &local_770;
        local_75c = local_15c4;
        local_760 = local_15cc;
        local_764 = local_15d4;
        local_770._0_4_ = local_15c4;
        local_770._4_4_ = local_15cc;
        local_788 = local_15d4;
        local_790 = local_770;
        local_ed4 = local_770;
        uVar10 = local_ed4;
        BlockDims3.field_0.field_0.X = local_15d4;
        bVar24 = false;
        local_ed4._0_4_ = (int)local_770;
        local_ed4._4_4_ = (int)((ulong)local_770 >> 0x20);
        if ((Ds.Subband == '\0') && (bVar24 = false, Ds.Level + 1 < (int)Idx2->NLevels)) {
          local_958 = &Idx2->BlockDims3;
          local_950 = &local_ed4;
          bVar24 = false;
          if (((int)local_ed4 == (local_958->field_0).field_0.X) &&
             (bVar24 = false, local_ed4._4_4_ == (Idx2->BlockDims3).field_0.field_0.Y)) {
            bVar24 = local_15d4 == (Idx2->BlockDims3).field_0.field_0.Z;
          }
        }
        local_ee0 = uVar8;
        local_eb8 = uVar9;
        local_e98 = uVar6;
        local_e70 = local_7f0;
        local_be8 = local_ed8;
        local_bc4 = local_ed8;
        local_990 = local_eb0;
        local_96c = local_eb0;
        local_3d8 = local_780;
        local_3d0 = local_778;
        if (!bVar24) {
          local_750 = &local_ed4;
          iVar13 = (uint)(1 < (int)local_ed4) + (uint)(1 < local_ed4._4_4_) + (uint)(1 < local_15d4)
          ;
          iVar14 = 1 << (char)iVar13 * '\x02';
          local_738 = &BufFloats.Alloc;
          local_740 = (double *)(long)iVar14;
          local_730 = &BufInts.Alloc;
          local_748 = 0;
          BufFloats.Size = 0;
          local_718 = &BufFloats.Alloc;
          local_720 = (long *)(long)iVar14;
          local_710 = BlockUInts + 0x3f;
          local_728 = 0;
          BufInts.Size = 0;
          local_ed4 = uVar10;
          BlockUInts[0x3f] = (u64)local_718;
          BufInts.Data = local_720;
          BufInts.Alloc = (allocator *)local_738;
          BufFloats.Data = local_740;
          memset(&BufUInts.Alloc,0,0x200);
          local_6f8 = &BufUInts.Alloc;
          local_700 = (unsigned_long *)
                      (long)((int)local_ed4 * local_ed4._4_4_ * BlockDims3.field_0.field_0.X);
          local_6f0 = (undefined1 *)&stack0xffffffffffffeca0;
          local_708 = 0;
          BufUInts.Size = 0;
          local_83d = Idx2->DType;
          switch(local_83d) {
          case int8:
          case uint8:
            local_83c = 1;
            break;
          case int16:
          case uint16:
            local_83c = 2;
            break;
          case int32:
          case uint32:
          case float32:
            local_83c = 4;
            break;
          case int64:
          case uint64:
          case float64:
            local_83c = 8;
            break;
          default:
            local_83c = 0;
          }
          iVar23 = (int)(uint)BrickExpsStream.BitBuf >> 3;
          if (local_83c < 5) {
            local_6d8 = (undefined1 *)&stack0xfffffffffffff1d8;
            Result_1._4_4_ = 8;
            if (0x40 < (int)((uint)BrickExpsStream.BitBuf + 8)) {
              BrickExpsStream.BitPtr = (byte *)(BrickExpsStream.Stream.Alloc)->_vptr_allocator;
              BrickExpsStream.BitBuf._0_4_ = (uint)BrickExpsStream.BitBuf & 7;
              local_3b0 = local_6d8;
              BrickExpsStream.Stream.Alloc =
                   (allocator *)
                   ((long)&(BrickExpsStream.Stream.Alloc)->_vptr_allocator + (long)iVar23);
            }
            Remaining_1._4_4_ = 8;
            local_330 = (ulong)BrickExpsStream.BitPtr >> ((byte)(uint)BrickExpsStream.BitBuf & 0x3f)
            ;
            local_310 = &bitstream::Masks;
            local_314 = 8;
            local_6e8 = local_330 & bitstream::Masks.Arr[8];
            local_2d4 = 8;
            BrickExpsStream.BitBuf._0_4_ = (uint)BrickExpsStream.BitBuf + 8;
            NBitPlanesDecoded._2_2_ = (short)local_6e8 + -0x7f;
            local_320 = local_6d8;
            local_2d0 = local_6d8;
          }
          else {
            local_6c0 = (undefined1 *)&stack0xfffffffffffff1d8;
            Result._4_4_ = 0x10;
            if (0x40 < (int)((uint)BrickExpsStream.BitBuf + 0x10)) {
              BrickExpsStream.BitPtr = (byte *)(BrickExpsStream.Stream.Alloc)->_vptr_allocator;
              BrickExpsStream.BitBuf._0_4_ = (uint)BrickExpsStream.BitBuf & 7;
              local_3b8 = local_6c0;
              BrickExpsStream.Stream.Alloc =
                   (allocator *)
                   ((long)&(BrickExpsStream.Stream.Alloc)->_vptr_allocator + (long)iVar23);
            }
            Remaining._4_4_ = 0x10;
            local_358 = (ulong)BrickExpsStream.BitPtr >> ((byte)(uint)BrickExpsStream.BitBuf & 0x3f)
            ;
            local_338 = &bitstream::Masks;
            local_33c = 0x10;
            local_6d0 = local_358 & bitstream::Masks.Arr[0x10];
            local_2e4 = 0x10;
            BrickExpsStream.BitBuf._0_4_ = (uint)BrickExpsStream.BitBuf + 0x10;
            NBitPlanesDecoded._2_2_ = (short)local_6d0 + -0x3ff;
            local_348 = local_6c0;
            local_2e0 = local_6c0;
          }
          NBitPlanesDecoded._1_1_ = 0;
          local_6a6 = Idx2->DType;
          switch(local_6a6) {
          case int8:
          case uint8:
            local_6a4 = 1;
            break;
          case int16:
          case uint16:
            local_6a4 = 2;
            break;
          case int32:
          case uint32:
          case float32:
            local_6a4 = 4;
            break;
          case int64:
          case uint64:
          case float64:
            local_6a4 = 8;
            break;
          default:
            local_6a4 = 0;
          }
          NBps = (i8)(local_6a4 << 3);
          local_6b0 = &NBps;
          local_6b8 = (undefined1 *)((long)&Z3.field_0 + 0xb);
          local_164d = NBps;
          if ((char)Z3.field_0.field_0.Z._3_1_ < NBps) {
            local_164d = Z3.field_0.field_0.Z._3_1_;
          }
          NBitPlanesDecoded._0_1_ = local_164d;
          local_6a5 = local_6a6;
          fStack_680 = Tolerance;
          ppaStack_1360 = local_6f8;
          BufUInts.Data = local_700;
          if (((double)Tolerance != 0.0) || (NAN((double)Tolerance))) {
            frexp((double)Tolerance,&local_684);
            local_688 = 0xfffffc02;
            local_2c0 = &local_684;
            local_2c8 = &local_688;
            in_stack_ffffffffffffe9ac = local_684;
            local_674 = local_684;
            if (local_684 < -0x3fe) {
              local_674 = -0x3fe;
              in_stack_ffffffffffffe9ac = local_674;
            }
          }
          else {
            local_674 = -0x3ff;
          }
          iVar15 = (local_674 - NBitPlanesDecoded._2_2_) + -5;
          Bp = '\0';
          iVar23 = Idx2->BitPlanesPerChunk;
          iVar28 = local_674;
          for (local_1375 = '?'; 0x40 - (char)NBitPlanesDecoded <= (int)local_1375;
              local_1375 = local_1375 + -1) {
            sVar11 = local_1375 + NBitPlanesDecoded._2_2_;
            StreamIt.Idx._6_2_ = (i16)((sVar11 + 0x400) / iVar23);
            iVar16 = (int)sVar11;
            fStack_698 = Tolerance;
            if (((double)Tolerance != 0.0) || (NAN((double)Tolerance))) {
              frexp((double)Tolerance,&local_69c);
              local_6a0 = 0xfffffc02;
              local_2b0 = &local_69c;
              local_2b8 = &local_6a0;
              in_stack_ffffffffffffe9a0 = local_69c;
              local_68c = local_69c;
              if (local_69c < -0x3fe) {
                local_68c = -0x3fe;
                in_stack_ffffffffffffe9a0 = local_68c;
              }
            }
            else {
              local_68c = -0x3ff;
            }
            uVar12 = (iVar16 - local_68c) + 1;
            StreamIt.Idx._5_1_ = (int)uVar12 < 0x3a;
            if (((bool)StreamIt.Idx._5_1_) && ((sVar11 + 0x400) % iVar23 == 0)) break;
            iVar27 = local_68c;
            Lookup<short,idx2::bitstream>
                      ((iterator *)&Stream,(idx2 *)StreamsPtr,
                       (hash_table<short,_idx2::bitstream> *)((long)&StreamIt.Idx + 6),
                       (short *)(ulong)uVar12);
            ReadChunkResult.Ok = false;
            ReadChunkResult._25_7_ = 0;
            local_670 = &Stream;
            uVar25 = *(char *)((long)&(StreamIt.Ht)->Keys +
                              (long)&(((StreamIt.Val)->Stream).Alloc)->_vptr_allocator) == '\x02';
            if ((bool)uVar25) {
              ReadChunkResult._24_8_ = StreamIt.Key;
            }
            else {
              ReadChunk((expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *)&ChunkCache,Idx2
                        ,D,stack0xfffffffffffff2e0,Ds.Level,Ds.Subband,StreamIt.Idx._6_2_);
              pp_Var7 = ReadChunkResult._vptr_expected;
              local_668 = &ChunkCache;
              in_stack_ffffffffffffe99a = ReadChunkResult.field_1.Err.Code;
              if ((ReadChunkResult.field_1.Err.Code & UnknownError) == NoError) {
                ChunkExpCache._0_4_ = 7;
              }
              else {
                local_660 = &ChunkCache;
                in_stack_ffffffffffffe990 = (bitstream *)&ReadChunkResult;
                local_650 = ReadChunkResult._vptr_expected + 1;
                in_stack_ffffffffffffe988 = *local_650;
                local_648 = ReadChunkResult._vptr_expected + 1;
                puVar17 = BinarySearch<unsigned_long,unsigned_long*>
                                    ((unsigned_long *)in_stack_ffffffffffffe988,
                                     (unsigned_long *)
                                     (*local_648 + (long)ReadChunkResult._vptr_expected[4] * 8),
                                     (unsigned_long *)&SbDims3.field_0.field_0.Z);
                local_658 = pp_Var7 + 1;
                iVar3 = *(int *)(pp_Var7[7] + ((long)puVar17 - (long)*local_658 >> 3) * 4);
                Insert<short,idx2::bitstream>
                          ((iterator *)&Stream,(short *)((long)&StreamIt.Idx + 6),
                           (bitstream *)(pp_Var7 + 0xd));
                ReadChunkResult._24_8_ = StreamIt.Key;
                local_828 = StreamIt.Key;
                *(long *)(StreamIt.Key + 0xc) = *(long *)StreamIt.Key + (long)iVar3;
                *(undefined8 *)(StreamIt.Key + 0x10) = **(undefined8 **)(StreamIt.Key + 0xc);
                StreamIt.Key[0x14] = 0;
                StreamIt.Key[0x15] = 0;
                ChunkExpCache._0_4_ = 0;
                local_830 = (long)iVar3;
              }
              expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code>::~expected
                        ((expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *)&ChunkCache);
              if ((int)ChunkExpCache != 0) break;
            }
            if ((StreamIt.Idx._5_1_ & 1) == 0) {
              Bp = Bp + '\x01';
            }
            local_638 = ReadChunkResult.Ok;
            uStack_637 = ReadChunkResult._25_7_;
            lVar19 = *(long *)(ReadChunkResult._24_8_ + 0x18);
            lVar18 = *(long *)ReadChunkResult._24_8_;
            iVar3 = *(int *)(ReadChunkResult._24_8_ + 0x28);
            if (iVar15 < 9) {
              Decode<unsigned_long>
                        ((unsigned_long *)CONCAT44(in_stack_ffffffffffffe9ac,iVar28),iVar16,
                         in_stack_ffffffffffffe9a0,
                         (i8 *)CONCAT44(iVar27,CONCAT13(uVar25,CONCAT12(in_stack_ffffffffffffe99a,
                                                                        in_stack_ffffffffffffe998)))
                         ,in_stack_ffffffffffffe990,
                         SUB81((ulong)in_stack_ffffffffffffe988 >> 0x38,0));
            }
            else {
              Bs._40_8_ = ReadChunkResult._24_8_;
              memcpy(local_620,(void *)ReadChunkResult._24_8_,0x30);
              X._7_1_ = NBitPlanesDecoded._1_1_;
              if ((char)NBitPlanesDecoded._1_1_ < '\x01') {
                local_16d8 = 0;
              }
              else {
                local_294 = (int)(char)NBitPlanesDecoded._1_1_;
                _FirstBatchCount = local_620;
                Result_2._4_4_ = 0x40 - (uint)Bs.BitBuf;
                local_280 = &local_294;
                local_288 = (long)&Result_2 + 4;
                local_16ac = local_294;
                if (Result_2._4_4_ < local_294) {
                  local_16ac = Result_2._4_4_;
                }
                local_298 = local_16ac;
                Remaining_2._4_4_ = local_16ac;
                local_248 = (ulong)Bs.BitPtr >> ((byte)(uint)Bs.BitBuf & 0x3f);
                local_228 = &bitstream::Masks;
                local_22c = local_16ac;
                local_238 = _FirstBatchCount;
                if (0x40 < local_16ac) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<unsigned long, 65>::operator[](int) const [t = unsigned long, N = 65]"
                               );
                }
                local_2a8 = local_248 & bitstream::Masks.Arr[local_16ac];
                local_20c = local_16ac;
                uVar12 = local_16ac + (uint)Bs.BitBuf;
                local_208 = _FirstBatchCount;
                if (local_16ac < local_294) {
                  Bs.Stream.Alloc =
                       (allocator *)
                       ((long)&(Bs.Stream.Alloc)->_vptr_allocator +
                       (long)((int)(uint)Bs.BitBuf >> 3));
                  Bs.BitBuf._0_4_ = (uint)Bs.BitBuf & 7;
                  Remaining_3._4_4_ = local_294 - local_16ac;
                  local_270 = (ulong)Bs.BitPtr >> (sbyte)(uint)Bs.BitBuf;
                  local_250 = &bitstream::Masks;
                  local_278 = _FirstBatchCount;
                  local_260 = _FirstBatchCount;
                  local_254 = Remaining_3._4_4_;
                  if (0x40 < Remaining_3._4_4_) {
                    __assert_fail("Idx < N",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                  ,0x20c,
                                  "t &idx2::stack_array<unsigned long, 65>::operator[](int) const [t = unsigned long, N = 65]"
                                 );
                  }
                  local_2a8 = (local_270 & bitstream::Masks.Arr[Remaining_3._4_4_]) <<
                              ((byte)local_16ac & 0x3f) | local_2a8;
                  local_21c = local_294 - local_16ac;
                  local_218 = _FirstBatchCount;
                  Bs.BitPtr = (byte *)(Bs.Stream.Alloc)->_vptr_allocator;
                  uVar12 = local_21c + (uint)Bs.BitBuf;
                }
                Bs.BitBuf._0_4_ = uVar12;
                local_16d8 = local_2a8;
              }
              local_630 = local_16d8;
              for (; (char)NBitPlanesDecoded._1_1_ < iVar14;
                  NBitPlanesDecoded._1_1_ = NBitPlanesDecoded._1_1_ + 1) {
                local_370 = local_620;
                if (0x40 < (int)((uint)Bs.BitBuf + 1)) {
                  iVar16 = (int)(uint)Bs.BitBuf >> 3;
                  Bs.BitPtr = (byte *)(Bs.Stream.Alloc)->_vptr_allocator;
                  Bs.BitBuf._0_4_ = (uint)Bs.BitBuf & 7;
                  local_3c8 = local_370;
                  Bs.Stream.Alloc =
                       (allocator *)((long)&(Bs.Stream.Alloc)->_vptr_allocator + (long)iVar16);
                }
                Remaining_4._4_4_ = 1;
                local_380 = (ulong)Bs.BitPtr >> ((byte)(uint)Bs.BitBuf & 0x3f);
                local_360 = &bitstream::Masks;
                local_364 = 1;
                local_2f4 = 1;
                Bs.BitBuf._0_4_ = (uint)Bs.BitBuf + 1;
                local_2f0 = local_370;
                if ((local_380 & bitstream::Masks.Arr[1]) == 0) break;
                for (; (char)NBitPlanesDecoded._1_1_ + 1 < iVar14;
                    NBitPlanesDecoded._1_1_ = NBitPlanesDecoded._1_1_ + 1) {
                  local_398 = local_620;
                  if (0x40 < (int)((uint)Bs.BitBuf + 1)) {
                    iVar16 = (int)(uint)Bs.BitBuf >> 3;
                    Bs.BitPtr = (byte *)(Bs.Stream.Alloc)->_vptr_allocator;
                    Bs.BitBuf._0_4_ = (uint)Bs.BitBuf & 7;
                    local_3c0 = local_398;
                    Bs.Stream.Alloc =
                         (allocator *)((long)&(Bs.Stream.Alloc)->_vptr_allocator + (long)iVar16);
                  }
                  Remaining_5._4_4_ = 1;
                  local_3a8 = (ulong)Bs.BitPtr >> ((byte)(uint)Bs.BitBuf & 0x3f);
                  local_388 = &bitstream::Masks;
                  local_38c = 1;
                  local_304 = 1;
                  Bs.BitBuf._0_4_ = (uint)Bs.BitBuf + 1;
                  local_300 = local_398;
                  if ((local_3a8 & bitstream::Masks.Arr[1]) != 0) break;
                }
                local_630 = local_630 + (1L << (NBitPlanesDecoded._1_1_ & 0x3f));
              }
              BlockUInts[(long)(0x3f - local_1375) + -1] = local_630;
              memcpy((void *)Bs._40_8_,local_620,0x2c);
            }
            local_640 = ReadChunkResult.Ok;
            uStack_63f = ReadChunkResult._25_7_;
            std::__atomic_base<unsigned_long>::operator+=
                      (&(D->BytesDecoded_).super___atomic_base<unsigned_long>,
                       ((*(long *)(ReadChunkResult._24_8_ + 0x18) - *(long *)ReadChunkResult._24_8_)
                        * 8 + (long)*(int *)(ReadChunkResult._24_8_ + 0x28)) -
                       ((lVar19 - lVar18) * 8 + (long)iVar3));
          }
          uVar10 = local_ed4;
          if (('\0' < Bp) && ((local_ea9 & 1U) == 0)) {
            if (8 < iVar15) {
              TransposeRecursive<unsigned_long>((unsigned_long *)&BufUInts.Alloc,(int)Bp);
            }
            local_1701 = true;
            if (Ds.Subband < '\x01') {
              local_1701 = Ds.Level + 1 == (int)Idx2->NLevels;
            }
            local_1702 = true;
            if ((Z3.field_0.field_0.Z._2_1_ & 1) == 0) {
              local_1702 = local_1701;
            }
            Z3.field_0.field_0.Z._2_1_ = local_1702;
            std::__atomic_base<long>::operator++(&(D->NSignificantBlocks).super___atomic_base<long>)
            ;
            switch(iVar13) {
            case 0:
              for (local_5a0 = 0; local_5a0 < 1; local_5a0 = local_5a0 + 1) {
                BlockFloats[(long)local_5a0 + -1] =
                     (f64)((BlockUInts[(long)local_5a0 + -1] ^ 0xaaaaaaaaaaaaaaaa) +
                          0x5555555555555556);
              }
              break;
            case 1:
              for (local_59c = 0; local_59c < 4; local_59c = local_59c + 1) {
                BlockFloats[(long)local_59c + -1] =
                     (f64)((BlockUInts[(long)local_59c + -1] ^ 0xaaaaaaaaaaaaaaaa) +
                          0x5555555555555556);
              }
              break;
            case 2:
              for (I_3 = 0; I_3 < 0x10; I_3 = I_3 + 1) {
                BlockFloats[(long)(char)Perm2[I_3] + -1] =
                     (f64)((BlockUInts[(long)I_3 + -1] ^ 0xaaaaaaaaaaaaaaaa) + 0x5555555555555556);
              }
              break;
            case 3:
              for (I_2 = 0; I_2 < 0x40; I_2 = I_2 + 1) {
                BlockFloats[(long)(char)Perm3[I_2] + -1] =
                     (f64)((BlockUInts[(long)I_2 + -1] ^ 0xaaaaaaaaaaaaaaaa) + 0x5555555555555556);
              }
            }
            ppaVar1 = &BufFloats.Alloc;
            if (iVar13 == 1) {
              X_9._4_4_ = 1;
              lVar18 = ((long)BlockFloats[2] >> 1) + (long)BlockFloats[0];
              lVar19 = (long)BlockFloats[2] - (lVar18 >> 1);
              lVar18 = lVar19 + lVar18;
              lVar22 = (long)&(BufFloats.Alloc)->_vptr_allocator + (long)BlockFloats[1];
              lVar20 = (long)BufFloats.Alloc * 2 - lVar22;
              Z_7 = lVar22 + lVar18;
              W_5 = lVar22 * 2 - Z_7;
              local_110 = lVar20 + (lVar19 * 2 - lVar18);
              Y_8 = lVar20 * 2 - local_110;
              local_e8 = ppaVar1;
              BufFloats.Alloc = (allocator *)Y_8;
            }
            else if (iVar13 == 2) {
              for (local_568 = 0; local_568 < 4; local_568 = local_568 + 1) {
                lVar22 = (long)local_568;
                local_148 = ppaVar1 + lVar22;
                X_7._4_4_ = 4;
                lVar18 = ((long)BlockFloats[lVar22 + 0xb] >> 1) + (long)BlockFloats[lVar22 + 3];
                lVar19 = (long)BlockFloats[lVar22 + 0xb] - (lVar18 >> 1);
                lVar18 = lVar19 + lVar18;
                lVar22 = (long)&(*local_148)->_vptr_allocator + (long)BlockFloats[lVar22 + 7];
                lVar20 = (long)*local_148 * 2 - lVar22;
                Z_5 = lVar22 + lVar18;
                W_3 = lVar22 * 2 - Z_5;
                local_170 = (allocator *)(lVar20 + (lVar19 * 2 - lVar18));
                Y_5 = lVar20 * 2 - (long)local_170;
                *local_148 = (allocator *)Y_5;
                local_148[X_7._4_4_] = (allocator *)Z_5;
                local_148[X_7._4_4_ << 1] = (allocator *)W_3;
                local_148[X_7._4_4_ * 3] = local_170;
              }
              for (local_56c = 0; local_56c < 4; local_56c = local_56c + 1) {
                lVar22 = (long)(local_56c << 2);
                ppaVar21 = ppaVar1 + lVar22;
                X_8._4_4_ = 1;
                lVar18 = ((long)BlockFloats[lVar22 + 2] >> 1) + (long)BlockFloats[lVar22];
                lVar19 = (long)BlockFloats[lVar22 + 2] - (lVar18 >> 1);
                lVar18 = lVar19 + lVar18;
                lVar22 = (long)&(*ppaVar21)->_vptr_allocator + (long)BlockFloats[lVar22 + 1];
                lVar20 = (long)*ppaVar21 * 2 - lVar22;
                Z_6 = lVar22 + lVar18;
                W_4 = lVar22 * 2 - Z_6;
                local_140 = (allocator *)(lVar20 + (lVar19 * 2 - lVar18));
                Y_7 = lVar20 * 2 - (long)local_140;
                *ppaVar21 = (allocator *)Y_7;
                ppaVar21[X_8._4_4_] = (allocator *)Z_6;
                ppaVar21[X_8._4_4_ << 1] = (allocator *)W_4;
                ppaVar21[X_8._4_4_ * 3] = local_140;
                local_118 = ppaVar21;
              }
            }
            else if (iVar13 == 3) {
              for (X_3 = 0; X_3 < 4; X_3 = X_3 + 1) {
                for (Z_1 = 0; Z_1 < 4; Z_1 = Z_1 + 1) {
                  local_1d8 = ppaVar1 + (long)Z_1 + (long)(X_3 << 2);
                  X_2._4_4_ = 0x10;
                  lVar18 = ((long)local_1d8[0x30] >> 1) + (long)local_1d8[0x10];
                  lVar19 = (long)local_1d8[0x30] - (lVar18 >> 1);
                  lVar18 = lVar19 + lVar18;
                  lVar22 = (long)&(*local_1d8)->_vptr_allocator + (long)local_1d8[0x20];
                  lVar20 = (long)*local_1d8 * 2 - lVar22;
                  Z = lVar22 + lVar18;
                  W = lVar22 * 2 - Z;
                  local_200 = (allocator *)(lVar20 + (lVar19 * 2 - lVar18));
                  Y_1 = lVar20 * 2 - (long)local_200;
                  *local_1d8 = (allocator *)Y_1;
                  local_1d8[X_2._4_4_] = (allocator *)Z;
                  local_1d8[X_2._4_4_ << 1] = (allocator *)W;
                  local_1d8[X_2._4_4_ * 3] = local_200;
                }
              }
              for (Z_3 = 0; Z_3 < 4; Z_3 = Z_3 + 1) {
                for (Y_3 = 0; Y_3 < 4; Y_3 = Y_3 + 1) {
                  local_1a8 = ppaVar1 + (long)(Y_3 << 4) + (long)Z_3;
                  X_4._4_4_ = 4;
                  lVar18 = ((long)local_1a8[0xc] >> 1) + (long)local_1a8[4];
                  lVar19 = (long)local_1a8[0xc] - (lVar18 >> 1);
                  lVar18 = lVar19 + lVar18;
                  lVar22 = (long)&(*local_1a8)->_vptr_allocator + (long)local_1a8[8];
                  lVar20 = (long)*local_1a8 * 2 - lVar22;
                  Z_2 = lVar22 + lVar18;
                  W_1 = lVar22 * 2 - Z_2;
                  local_1d0 = (allocator *)(lVar20 + (lVar19 * 2 - lVar18));
                  Y_2 = lVar20 * 2 - (long)local_1d0;
                  *local_1a8 = (allocator *)Y_2;
                  local_1a8[X_4._4_4_] = (allocator *)Z_2;
                  local_1a8[X_4._4_4_ << 1] = (allocator *)W_1;
                  local_1a8[X_4._4_4_ * 3] = local_1d0;
                }
              }
              for (X_6 = 0; X_6 < 4; X_6 = X_6 + 1) {
                for (Y_6 = 0; Y_6 < 4; Y_6 = Y_6 + 1) {
                  local_178 = ppaVar1 + (long)(Y_6 << 2) + (long)(X_6 << 4);
                  X_5._4_4_ = 1;
                  lVar18 = ((long)local_178[3] >> 1) + (long)local_178[1];
                  lVar19 = (long)local_178[3] - (lVar18 >> 1);
                  lVar18 = lVar19 + lVar18;
                  lVar22 = (long)&(*local_178)->_vptr_allocator + (long)local_178[2];
                  lVar20 = (long)*local_178 * 2 - lVar22;
                  Z_4 = lVar22 + lVar18;
                  W_2 = lVar22 * 2 - Z_4;
                  local_1a0 = (allocator *)(lVar20 + (lVar19 * 2 - lVar18));
                  Y_4 = lVar20 * 2 - (long)local_1a0;
                  *local_178 = (allocator *)Y_4;
                  local_178[X_5._4_4_] = (allocator *)Z_4;
                  local_178[X_5._4_4_ << 1] = (allocator *)W_2;
                  local_178[X_5._4_4_ * 3] = local_1a0;
                }
              }
            }
            puVar2 = BlockUInts + 0x3f;
            _Var26 = std::ldexp<int>(1,(0x3e - iVar13) - (int)NBitPlanesDecoded._2_2_);
            for (local_53c = 0; local_e0 = puVar2, (long *)(long)local_53c != BufInts.Data;
                local_53c = local_53c + 1) {
              local_d8 = (long)local_53c;
              local_d0 = puVar2;
              if ((long)BufInts.Data <= local_d8) {
                __assert_fail("Idx < Size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Memory.h"
                              ,0x1b2,"t &idx2::buffer_t<long>::operator[](i64) const [t = long]");
              }
              local_c8 = (long)local_53c;
              local_c0 = &BufInts.Alloc;
              if ((long)BufFloats.Data <= local_c8) {
                __assert_fail("Idx < Size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Memory.h"
                              ,0x1b2,"t &idx2::buffer_t<double>::operator[](i64) const [t = double]"
                             );
              }
              BufInts.Alloc[local_c8]._vptr_allocator =
                   (_func_int **)
                   ((1.0 / _Var26) * (double)*(long *)(BlockUInts[0x3f] + local_d8 * 8));
            }
            From3.field_0.field_0.Y = 0;
            local_900 = (SbGrid->super_extent).From;
            local_8e4 = ((int)local_900 << 0xb) >> 0xb;
            local_8e0 = &local_8f8;
            local_8e8 = (int)((long)(local_900 << 0x16) >> 0x2b);
            From3.field_0.field_0.X = (int)((long)(local_900 * 2) >> 0x2b);
            local_8f8._0_4_ = local_8e4;
            local_8f8._4_4_ = local_8e8;
            local_910 = local_8f8;
            local_938 = local_8f8;
            local_920 = local_8f8;
            local_948 = local_8f8;
            Strd3.field_0._4_8_ = local_8f8;
            local_1418 = local_8f8;
            local_890 = SbGrid->Strd;
            local_874 = ((int)local_890 << 0xb) >> 0xb;
            local_870 = &local_888;
            local_878 = (int)((long)(local_890 << 0x16) >> 0x2b);
            Strd3.field_0.field_0.X = (int)((long)(local_890 * 2) >> 0x2b);
            local_888._0_4_ = local_874;
            local_888._4_4_ = local_878;
            local_8a0 = local_888;
            local_8c8 = local_888;
            local_8b0 = local_888;
            local_8d8 = local_888;
            DataTimer.Start.tv_nsec = local_888;
            local_1434 = local_888;
            local_940 = From3.field_0.field_0.X;
            local_930 = From3.field_0.field_0.X;
            local_928 = SbGrid;
            local_918 = From3.field_0.field_0.X;
            local_908 = From3.field_0.field_0.X;
            local_8ec = From3.field_0.field_0.X;
            local_8d0 = Strd3.field_0.field_0.X;
            local_8c0 = Strd3.field_0.field_0.X;
            local_8b8 = SbGrid;
            local_8a8 = Strd3.field_0.field_0.X;
            local_898 = Strd3.field_0.field_0.X;
            local_87c = Strd3.field_0.field_0.X;
            clock_gettime(1,(timespec *)&BVol);
            local_b60 = &local_146c;
            local_b64 = 0;
            local_146c = 0;
            local_1468 = 0;
            local_1464 = 0;
            for (S3.field_0.field_0.X = 0; S3.field_0.field_0.X < BlockDims3.field_0.field_0.X;
                S3.field_0.field_0.X = S3.field_0.field_0.X + 1) {
              local_b50 = &local_1478;
              local_b54 = 0;
              local_1478 = 0;
              local_1474 = 0;
              local_1470 = 0;
              for (J = 0; J < local_ed4._4_4_; J = J + 1) {
                local_b40 = &local_1484;
                local_b44 = 0;
                local_1484 = 0;
                local_1480 = 0;
                local_147c = 0;
                for (From3.field_0.field_0.Z = 0; From3.field_0.field_0.Z < (int)local_ed4;
                    From3.field_0.field_0.Z = From3.field_0.field_0.Z + 1) {
                  lVar19 = (long)From3.field_0.field_0.Y;
                  From3.field_0.field_0.Y = From3.field_0.field_0.Y + 1;
                  local_af0 = &local_e98;
                  local_af8 = (undefined1 *)((long)&From3.field_0 + 8);
                  local_1498 = D3.field_0.field_0.X + S3.field_0.field_0.X;
                  local_ad0 = &local_ae8;
                  local_ad4 = (int)local_e98 + From3.field_0.field_0.Z;
                  local_ad8 = local_e98._4_4_ + J;
                  local_adc = local_1498;
                  local_ae8._0_4_ = (int)local_e98 + From3.field_0.field_0.Z;
                  local_ae8._4_4_ = local_e98._4_4_ + J;
                  local_b00 = local_1498;
                  local_b08 = local_ae8;
                  local_14a0 = local_ae8;
                  local_1490 = local_ae8;
                  uVar6 = local_1490;
                  local_4c0 = BrickVol;
                  local_4c8 = &local_1418;
                  local_4d0 = &local_1434;
                  local_4d8 = &local_1490;
                  local_4a0 = &local_1490;
                  local_4a8 = &local_1434;
                  local_1490._0_4_ = (int)local_ae8;
                  local_1490._4_4_ = (int)((ulong)local_ae8 >> 0x20);
                  local_48c = local_1498 * Strd3.field_0.field_0.X;
                  local_480 = &local_498;
                  local_484 = (int)local_1490 * (int)local_1434;
                  local_488 = local_1490._4_4_ * local_1434._4_4_;
                  local_498._0_4_ = (int)local_1490 * (int)local_1434;
                  local_498._4_4_ = local_1490._4_4_ * local_1434._4_4_;
                  local_4b0 = local_48c;
                  local_4b8 = local_498;
                  local_4f0 = local_48c;
                  local_4f8 = local_498;
                  uVar9 = local_4f8;
                  local_460 = &local_1418;
                  local_468 = &local_4f8;
                  local_4f8._0_4_ = (int)local_498;
                  local_4f8._4_4_ = (int)((ulong)local_498 >> 0x20);
                  local_44c = From3.field_0.field_0.X + local_48c;
                  local_440 = &local_458;
                  local_444 = (int)local_1418 + (int)local_4f8;
                  local_448 = local_1418._4_4_ + local_4f8._4_4_;
                  local_458._0_4_ = (int)local_1418 + (int)local_4f8;
                  local_458._4_4_ = local_1418._4_4_ + local_4f8._4_4_;
                  local_470 = local_44c;
                  local_478 = local_458;
                  local_4e0 = local_44c;
                  local_4e8 = local_458;
                  uVar8 = local_4e8;
                  D3_1.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)&local_4e8;
                  uVar4 = (BrickVol->Vol).Dims;
                  local_24 = ((int)uVar4 << 0xb) >> 0xb;
                  local_20 = &local_38;
                  local_28 = (int)((long)(uVar4 << 0x16) >> 0x2b);
                  local_2c = (int)((long)(uVar4 * 2) >> 0x2b);
                  local_38._0_4_ = local_24;
                  local_38._4_4_ = local_28;
                  local_b0 = local_2c;
                  local_b8 = local_38;
                  local_a4 = local_38;
                  uVar10 = local_a4;
                  D3_1.field_0.field_0.X = local_2c;
                  local_10 = &local_a4;
                  local_18 = (anon_union_8_4_6ba14846_for_v2<int>_1)&local_4e8;
                  local_a4._0_4_ = (int)local_38;
                  local_a4._4_4_ = (int)((ulong)local_38 >> 0x20);
                  local_4e8._4_4_ = (int)((ulong)local_458 >> 0x20);
                  local_4e8._0_4_ = (int)local_458;
                  *(f64 *)((BrickVol->Vol).Buffer.Data +
                          ((long)local_44c * (long)(int)local_a4 * (long)local_a4._4_4_ +
                           (long)local_4e8._4_4_ * (long)(int)local_a4 + (long)(int)local_4e8) * 8)
                       = BlockFloats[lVar19 + -1];
                  local_b30 = &local_14ac;
                  local_b34 = 1;
                  local_14ac = 1;
                  local_14a8 = 1;
                  local_14a4 = 1;
                  local_1490 = uVar6;
                  local_1488 = local_1498;
                  local_4f8 = uVar9;
                  local_4e8 = uVar8;
                  local_a4 = uVar10;
                }
                local_b20 = &local_14b8;
                local_b24 = 1;
                local_14b8 = 1;
                local_14b4 = 1;
                local_14b0 = 1;
              }
              local_b10 = &local_14c4;
              local_b14 = 1;
              local_14c4 = 1;
              local_14c0 = 1;
              local_14bc = 1;
            }
            End.tv_nsec = (__syscall_slong_t)&BVol;
            local_1460 = BrickVol;
            clock_gettime(1,(timespec *)local_a78);
            std::__atomic_base<unsigned_long>::operator+=
                      (&(D->DataMovementTime_).super___atomic_base<unsigned_long>,
                       (long)((double)((long)local_a78 - *(long *)End.tv_nsec) * 1000000000.0 +
                             (double)(End.tv_sec - *(long *)(End.tv_nsec + 8))));
            uVar10 = local_ed4;
          }
        }
      }
      else {
        local_7c0 = Z3.field_0.field_0.Y;
        local_7c1 = 0xff;
        if (Z3.field_0.field_0.Y == 0) {
          local_1557 = -1;
        }
        else {
          local_1557 = '\0';
          for (uVar5 = Z3.field_0.field_0.Y; (uVar5 & 1) == 0; uVar5 = (uint)uVar5 >> 1 | 0x80000000
              ) {
            local_1557 = local_1557 + '\x01';
          }
        }
        D3.field_0.field_0.Y = (int)local_1557;
        Z3.field_0.field_0.Y =
             (((uint)Z3.field_0.field_0.Y >> (local_1557 + 1U & 0x1f)) + 1 <<
             (local_1557 + 1U & 0x1f)) + -1;
        uVar10 = local_ed4;
        local_e70 = local_7f0;
      }
      local_ed4 = uVar10;
    }
    std::__atomic_base<long>::operator+=
              (&(D->NInsignificantSubbands).super___atomic_base<long>,
               (ulong)((Z3.field_0.field_0.Z._2_1_ & 1) == 0));
    local_438 = (undefined1 *)((long)&Z3.field_0 + 10);
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002bfb30;
    (__return_storage_ptr__->field_1).Val = (bool)(Z3.field_0.field_0.Z._2_1_ & 1);
    __return_storage_ptr__->Ok = true;
    local_430 = __return_storage_ptr__;
  }
  expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code>::~expected
            ((expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *)local_dd8);
  return __return_storage_ptr__;
}

Assistant:

static expected<bool, idx2_err_code>
DecodeSubband(const idx2_file& Idx2,
              decode_data* D,
              decode_state Ds,
              f64 Tolerance, // TODO: move to decode_state
              const grid& SbGrid, // TODO: move to decode_state
              hash_table<i16, bitstream> *StreamsPtr,
              brick_volume* BrickVol) // TODO: move to decode_states
{
  u64 Brick = Ds.Brick;
  v3i SbDims3 = Dims(SbGrid);
  v3i NBlocks3 = (SbDims3 + Idx2.BlockDims3 - 1) / Idx2.BlockDims3;
  int BlockCount = Prod(NBlocks3);
  // the following subtracts blocks on subband 0 that are coded in the next level
  // meaning, we only code subband-0 blocks that are on the boundary (extrapolated)
  if (Ds.Subband == 0 && Ds.Level + 1 < Idx2.NLevels)
    BlockCount -= Prod(SbDims3 / Idx2.BlockDims3);

  /* first, read the block exponents */
  auto ReadChunkExpResult = ReadChunkExponents(Idx2, D, Brick, Ds.Level, Ds.Subband);
  if (!ReadChunkExpResult)
    return Error(ReadChunkExpResult);

  const chunk_exp_cache* ChunkExpCache = Value(ReadChunkExpResult);
  i32 BrickExpOffset = (Ds.BrickInChunk * BlockCount) * (SizeOf(Idx2.DType) > 4 ? 2 : 1);
  bitstream BrickExpsStream = ChunkExpCache->ChunkExpStream;
  SeekToByte(&BrickExpsStream, BrickExpOffset);
  u32 LastBlock = EncodeMorton3(v3<u32>(NBlocks3 - 1));
  const i8 NBitPlanes = idx2_BitSizeOf(u64);
  Clear(StreamsPtr);

  bool SubbandSignificant = false; // whether there is any significant block on this subband
  idx2_InclusiveFor (u32, Block, 0, LastBlock)
  { // zfp block loop
    v3i Z3(DecodeMorton3(Block));
    idx2_NextMorton(Block, Z3, NBlocks3);
    v3i D3 = Z3 * Idx2.BlockDims3;
    //if (Ds.Level ==0 && Ds.Subband == 0)
    //  printf("D3 " idx2_PrStrV3i " Spacing " idx2_PrStrV3i "\n", idx2_PrV3i(D3), idx2_PrV3i(Idx2.DecodeSubbandSpacings[Ds.Level][Ds.Subband]));
    bool BypassDecode = (D3 % Idx2.DecodeSubbandSpacings[Ds.Level][Ds.Subband]) != 0;
    v3i BlockDims3 = Min(Idx2.BlockDims3, SbDims3 - D3);
    bool CodedInNextLevel =
      Ds.Subband == 0 && Ds.Level + 1 < Idx2.NLevels && BlockDims3 == Idx2.BlockDims3;
    if (CodedInNextLevel)
      continue;

    const int NDims = NumDims(BlockDims3);
    const int NVals = 1 << (2 * NDims);
    const int Prec = NBitPlanes - 1 - NDims;
    f64 BlockFloats[4 * 4 * 4];
    buffer_t BufFloats(BlockFloats, NVals);
    buffer_t BufInts((i64*)BlockFloats, NVals);
    u64 BlockUInts[4 * 4 * 4] = {};
    buffer_t BufUInts(BlockUInts, Prod(BlockDims3));

    // we read the exponent for the block
    i16 EMax = SizeOf(Idx2.DType) > 4
                 ? (i16)Read(&BrickExpsStream, 16) - traits<f64>::ExpBias
                 : (i16)Read(&BrickExpsStream, traits<f32>::ExpBits) - traits<f32>::ExpBias;
    i8 N = 0;
    i8 EndBitPlane = Min(i8(BitSizeOf(Idx2.DType)), NBitPlanes);
    int NBitPlanesDecoded = Exponent(Tolerance) - 6 - EMax + 1;
    i8 NBps = 0;
    int Bpc = Idx2.BitPlanesPerChunk;
    idx2_InclusiveForBackward (i8, Bp, NBitPlanes - 1, NBitPlanes - EndBitPlane)
    { // bit plane loop
      i16 RealBp = Bp + EMax;
      i16 BpKey = (RealBp + BitPlaneKeyBias_) / Bpc; // make it so that the BpKey is positive
      // TODO: always decode extra 6 bit planes?
      bool TooHighPrecision = NBitPlanes - 6 > RealBp - Exponent(Tolerance) + 1;
      if (TooHighPrecision)
      {
        if ((RealBp + BitPlaneKeyBias_) % Bpc == 0) // make sure we encode full "block" of BpKey
          break;
      }

      auto StreamIt = Lookup(*StreamsPtr, BpKey);
      bitstream* Stream = nullptr;
      if (!StreamIt)
      { // first block in the brick
        auto ReadChunkResult = ReadChunk(Idx2, D, Brick, Ds.Level, Ds.Subband, BpKey);
        if (!ReadChunkResult)
          //return Error(ReadChunkResult);
          break;

        const chunk_cache* ChunkCache = Value(ReadChunkResult);
        auto BrickIt = BinarySearch(idx2_Range(ChunkCache->Bricks), Brick);
        idx2_Assert(BrickIt != End(ChunkCache->Bricks));
        idx2_Assert(*BrickIt == Brick);
        i64 BrickInChunk = BrickIt - Begin(ChunkCache->Bricks);
        idx2_Assert(BrickInChunk < Size(ChunkCache->BrickOffsets));
        i64 BrickOffset = ChunkCache->BrickOffsets[BrickInChunk];
        // TODO: this addition is to bypass the part of the chunk stream that stores the brick offsets
        // but this is only correct if the first brick to decode is also first in the chunk stream
        //BrickOffset += Size(ChunkCache->ChunkStream);
        Insert(&StreamIt, BpKey, ChunkCache->ChunkStream);
        Stream = StreamIt.Val;
        // seek to the correct byte offset of the brick in the chunk
        //printf("stream end %llu  brick offset %llu\n", Size(Stream->Stream), BrickOffset);
        SeekToByte(Stream, BrickOffset);
      }
      else // if the stream already exists
      {
        Stream = StreamIt.Val;
      }
      /* zfp decode */
      if (!TooHighPrecision)
        ++NBps;
      auto SizeBegin = BitSize(*Stream);
      if (NBitPlanesDecoded <= 8)
        Decode(BlockUInts, NVals, Bp, N, Stream, BypassDecode); // use AVX2
      else // delay the transpose of bits to later
        DecodeTest(&BlockUInts[NBitPlanes - 1 - Bp], NVals, N, Stream);
      auto SizeEnd = BitSize(*Stream);
      D->BytesDecoded_ += SizeEnd - SizeBegin;
    } // end bit plane loop

    /* do inverse zfp transform but only if any bit plane is decoded */
    if (NBps > 0 && !BypassDecode)
    {
      if (NBitPlanesDecoded > 8)
        TransposeRecursive(BlockUInts, NBps);

      // if the subband is not 0 or if this is the last level, we count this block
      // as significant, otherwise it is not significant
      bool CurrBlockSignificant = (Ds.Subband > 0 || Ds.Level + 1 == Idx2.NLevels);
      SubbandSignificant = SubbandSignificant || CurrBlockSignificant;
      ++D->NSignificantBlocks;
      InverseShuffle(BlockUInts, (i64*)BlockFloats, NDims);
      InverseZfp((i64*)BlockFloats, NDims);
      Dequantize(EMax, Prec, BufInts, &BufFloats);
      v3i S3;
      int J = 0;
      v3i From3 = From(SbGrid), Strd3 = Strd(SbGrid);
      timer DataTimer;
      StartTimer(&DataTimer);
      volume& BVol = BrickVol->Vol;
      idx2_BeginFor3 (S3, v3i(0), BlockDims3, v3i(1))
      { // sample loop
        idx2_Assert(D3 + S3 < SbDims3);
        BVol.At<f64>(From3, Strd3, D3 + S3) = BlockFloats[J++];
      }
      idx2_EndFor3; // end sample loop
      D->DataMovementTime_ += ElapsedTime(&DataTimer);
    }
  }
  D->NInsignificantSubbands += (SubbandSignificant == false);
  //printf("%d\n", AnyBlockDecoded);

  return SubbandSignificant;
}